

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

numeric * cs_impl::math_cs_ext::_max(numeric *a,numeric *b)

{
  bool bVar1;
  longlong *dat;
  longdouble *dat_00;
  numeric *in_RDX;
  numeric *in_RSI;
  numeric *in_RDI;
  longdouble local_48;
  longdouble local_38;
  numeric_integer local_28;
  numeric_integer local_20;
  numeric *local_18;
  numeric *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = cs::numeric::is_integer(in_RSI);
  if ((bVar1) && (bVar1 = cs::numeric::is_integer(local_18), bVar1)) {
    local_20 = cs::numeric::as_integer(local_10);
    local_28 = cs::numeric::as_integer(local_18);
    dat = std::max<long_long>(&local_20,&local_28);
    cs::numeric::numeric<long_long>(in_RDI,dat);
  }
  else {
    cs::numeric::as_float((numeric_float *)local_10,in_RSI);
    cs::numeric::as_float((numeric_float *)local_18,in_RSI);
    dat_00 = std::max<long_double>(&local_38,&local_48);
    cs::numeric::numeric<long_double>(in_RDI,dat_00);
  }
  return in_RDI;
}

Assistant:

numeric _max(const numeric& a, const numeric& b)
		{
			if (a.is_integer() && b.is_integer())
				return (std::max)(a.as_integer(), b.as_integer());
			else
				return (std::max)(a.as_float(), b.as_float());
		}